

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode writeNamespaces(void *handle,UA_NodeId nodeid,UA_Variant *data,UA_NumericRange *range)

{
  void *pvVar1;
  ulong uVar2;
  UA_Boolean UVar3;
  UA_StatusCode UVar4;
  UA_Server *server;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  UA_String name;
  
  UVar4 = 0x80740000;
  if (data->type != (UA_DataType *)0x13b5a0) {
    return 0x80740000;
  }
  pvVar1 = data->data;
  if (pvVar1 != (void *)0x0) {
    if (range == (UA_NumericRange *)0x0) {
      uVar2 = data->arrayLength;
      uVar8 = *(ulong *)((long)handle + 0x58);
      if (uVar2 <= uVar8) {
        return 0x80740000;
      }
      lVar7 = uVar8 + 1;
      lVar5 = 0;
      do {
        lVar7 = lVar7 + -1;
        if (lVar7 == 0) {
          puVar6 = (undefined8 *)((long)pvVar1 + uVar8 * 0x10 + 8);
          for (; uVar8 < uVar2; uVar8 = uVar8 + 1) {
            name.data = (UA_Byte *)*puVar6;
            name.length = puVar6[-1];
            addNamespace((UA_Server *)handle,name);
            puVar6 = puVar6 + 2;
          }
          return 0;
        }
        UVar3 = UA_String_equal((UA_String *)(lVar5 + *(long *)((long)handle + 0x60)),
                                (UA_String *)((long)pvVar1 + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (UVar3);
    }
    UVar4 = 0x80020000;
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
writeNamespaces(void *handle, const UA_NodeId nodeid, const UA_Variant *data,
                const UA_NumericRange *range) {
    UA_Server *server = (UA_Server*)handle;

    /* Check the data type */
    if(data->type != &UA_TYPES[UA_TYPES_STRING])
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Check that the variant is not empty */
    if(!data->data)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* TODO: Writing with a range is not implemented */
    if(range)
        return UA_STATUSCODE_BADINTERNALERROR;

    UA_String *newNamespaces = data->data;
    size_t newNamespacesSize = data->arrayLength;

    /* Test if we append to the existing namespaces */
    if(newNamespacesSize <= server->namespacesSize)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Test if the existing namespaces are unchanged */
    for(size_t i = 0; i < server->namespacesSize; ++i) {
        if(!UA_String_equal(&server->namespaces[i], &newNamespaces[i]))
            return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Add namespaces */
    for(size_t i = server->namespacesSize; i < newNamespacesSize; ++i)
        addNamespace(server, newNamespaces[i]);
    return UA_STATUSCODE_GOOD;
}